

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void disableTerm(WhereLevel *pLevel,WhereTerm *pTerm)

{
  u8 *puVar1;
  ushort uVar2;
  WhereTerm *pWVar3;
  int iVar4;
  long lVar5;
  ushort uVar6;
  bool bVar7;
  
  iVar4 = 0;
  while( true ) {
    uVar2 = pTerm->wtFlags;
    if ((uVar2 & 4) != 0) {
      return;
    }
    if ((pLevel->iLeftJoin != 0) && ((pTerm->pExpr->flags & 1) == 0)) {
      return;
    }
    if ((pLevel->notReady & pTerm->prereqAll) != 0) {
      return;
    }
    uVar6 = 0x200;
    if ((uVar2 >> 10 & 1) == 0) {
      uVar6 = 4;
    }
    bVar7 = iVar4 == 0;
    iVar4 = iVar4 + -1;
    if (bVar7) {
      uVar6 = 4;
    }
    pTerm->wtFlags = uVar6 | uVar2;
    lVar5 = (long)pTerm->iParent;
    if (lVar5 < 0) break;
    pWVar3 = pTerm->pWC->a;
    pTerm = pWVar3 + lVar5;
    puVar1 = &pWVar3[lVar5].nChild;
    *puVar1 = *puVar1 + 0xff;
    if (*puVar1 != '\0') {
      return;
    }
  }
  return;
}

Assistant:

static void disableTerm(WhereLevel *pLevel, WhereTerm *pTerm){
  int nLoop = 0;
  assert( pTerm!=0 );
  while( (pTerm->wtFlags & TERM_CODED)==0
      && (pLevel->iLeftJoin==0 || ExprHasProperty(pTerm->pExpr, EP_OuterON))
      && (pLevel->notReady & pTerm->prereqAll)==0
  ){
    if( nLoop && (pTerm->wtFlags & TERM_LIKE)!=0 ){
      pTerm->wtFlags |= TERM_LIKECOND;
    }else{
      pTerm->wtFlags |= TERM_CODED;
    }
#ifdef WHERETRACE_ENABLED
    if( sqlite3WhereTrace & 0x20000 ){
      sqlite3DebugPrintf("DISABLE-");
      sqlite3WhereTermPrint(pTerm, (int)(pTerm - (pTerm->pWC->a)));
    }
#endif
    if( pTerm->iParent<0 ) break;
    pTerm = &pTerm->pWC->a[pTerm->iParent];
    assert( pTerm!=0 );
    pTerm->nChild--;
    if( pTerm->nChild!=0 ) break;
    nLoop++;
  }
}